

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasRootProperty(RecyclableObject *instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  RecyclableObject *instance_00;
  RootObjectBase *rootObject;
  PropertyId propertyId_local;
  RecyclableObject *instance_local;
  
  bVar2 = VarIs<Js::RootObjectBase,Js::RecyclableObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x67e,"(VarIs<RootObjectBase>(instance))",
                                "VarIs<RootObjectBase>(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6b])(instance,(ulong)(uint)propertyId);
  if (iVar3 == 0) {
    instance_00 = RecyclableObject::GetPrototype(instance);
    instance_local._4_4_ = HasProperty(instance_00,propertyId);
  }
  else {
    instance_local._4_4_ = 1;
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::HasRootProperty(RecyclableObject* instance, PropertyId propertyId)
    {
        Assert(VarIs<RootObjectBase>(instance));

        RootObjectBase* rootObject = static_cast<RootObjectBase*>(instance);
        if (rootObject->HasRootProperty(propertyId))
        {
            return true;
        }
        instance = instance->GetPrototype();

        return HasProperty(instance, propertyId);
    }